

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::changeEvent(QMessageBox *this,QEvent *ev)

{
  Type TVar1;
  int value;
  QMessageBoxPrivate *this_00;
  QStyle *pQVar2;
  QEvent *in_RSI;
  QDialogButtonBox *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  TextInteractionFlags flags;
  QWidget *in_stack_ffffffffffffffb8;
  QWidget *this_01;
  undefined4 in_stack_ffffffffffffffc8;
  QFlagsStorage<Qt::TextInteractionFlag> flags_00;
  QFlag local_10;
  QFlagsStorage<Qt::TextInteractionFlag> local_c;
  long local_8;
  undefined1 center;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a623f);
  TVar1 = QEvent::type(in_RSI);
  if (((TVar1 != ApplicationFontChange) && (TVar1 != FontChange)) && (TVar1 == StyleChange)) {
    if (this_00->icon != NoIcon) {
      setIcon((QMessageBox *)this_00,100);
    }
    local_c.i = 0xaaaaaaaa;
    pQVar2 = QWidget::style(in_stack_ffffffffffffffb8);
    value = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x46,0,in_RDI);
    QFlag::QFlag(&local_10,value);
    QFlags<Qt::TextInteractionFlag>::QFlagsStorageHelper
              ((QFlags<Qt::TextInteractionFlag> *)in_stack_ffffffffffffffb8,
               (QFlag)(int)((ulong)in_RDI >> 0x20));
    flags_00.i = local_c.i;
    QLabel::setTextInteractionFlags((QLabel *)this_00,(TextInteractionFlags)local_c.i);
    this_01 = &this_00->buttonBox->super_QWidget;
    pQVar2 = QWidget::style(this_01);
    center = (undefined1)((ulong)this_01 >> 0x38);
    (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x48,0,in_RDI);
    QDialogButtonBox::setCenterButtons(in_RDI,(bool)center);
    if (this_00->informativeLabel != (QLabel *)0x0) {
      QLabel::setTextInteractionFlags((QLabel *)this_00,(TextInteractionFlags)flags_00.i);
    }
  }
  QWidget::changeEvent((QWidget *)this_00,(QEvent *)CONCAT44(TVar1,in_stack_ffffffffffffffc8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMessageBox::changeEvent(QEvent *ev)
{
    Q_D(QMessageBox);
    switch (ev->type()) {
    case QEvent::StyleChange:
    {
        if (d->icon != NoIcon)
            setIcon(d->icon);
        Qt::TextInteractionFlags flags(style()->styleHint(QStyle::SH_MessageBox_TextInteractionFlags, nullptr, this));
        d->label->setTextInteractionFlags(flags);
        d->buttonBox->setCenterButtons(style()->styleHint(QStyle::SH_MessageBox_CenterButtons, nullptr, this));
        if (d->informativeLabel)
            d->informativeLabel->setTextInteractionFlags(flags);
        Q_FALLTHROUGH();
    }
    case QEvent::FontChange:
    case QEvent::ApplicationFontChange:
#ifdef Q_OS_MAC
    {
        QFont f = font();
        f.setBold(true);
        d->label->setFont(f);
    }
#endif
        Q_FALLTHROUGH();
    default:
        break;
    }
    QDialog::changeEvent(ev);
}